

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

void __thiscall UnifiedRegex::Compiler::CaptureLiterals(Compiler *this,Node *root,Char *litbuf)

{
  Type *addr;
  Program *pPVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  BOOL BVar6;
  Recycler *this_00;
  undefined4 *puVar7;
  char16_t *pcVar8;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  uVar4 = (*root->_vptr_Node[3])(root,this);
  uVar5 = (**root->_vptr_Node)(root);
  if (uVar4 < uVar5) {
    Js::Throw::OutOfMemory();
  }
  data._32_8_ = litbuf;
  if (uVar4 == 0) {
    pcVar8 = (char16_t *)0x0;
  }
  else {
    local_70 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_a77b940;
    data.filename._0_4_ = 0x11c6;
    data.plusSize = (ulong)uVar4;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (this->scriptContext->recycler,(TrackAllocData *)local_70);
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00eb5fcb;
      *puVar7 = 0;
    }
    pcVar8 = (char16_t *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                       (this_00,(ulong)uVar4 * 2);
    if (pcVar8 == (char16_t *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00eb5fcb;
      *puVar7 = 0;
    }
  }
  pPVar1 = this->program;
  addr = (pPVar1->rep).singleChar.padding + 0xe;
  Memory::Recycler::WBSetBit((char *)addr);
  (pPVar1->rep).insts.litbuf.ptr = pcVar8;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  (this->program->rep).insts.litbufLen = 0;
  (*root->_vptr_Node[4])(root,this,data._32_8_);
  if ((this->program->rep).insts.litbufLen != uVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x11ca,"(program->rep.insts.litbufLen == finalLen)",
                       "program->rep.insts.litbufLen == finalLen");
    if (!bVar3) {
LAB_00eb5fcb:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  return;
}

Assistant:

void Compiler::CaptureLiterals(Node* root, const Char* litbuf)
    {
        // Program will own literal buffer. Prepare buffer and nodes for case-invariant matching if necessary.
        CharCount finalLen = root->TransferPass0(*this, litbuf);
        if (finalLen < root->LiteralLength()) // overflowed
        {
            Js::Throw::OutOfMemory();
        }

        program->rep.insts.litbuf = finalLen == 0 ? 0 : RecyclerNewArrayLeaf(scriptContext->GetRecycler(), Char, finalLen);

        program->rep.insts.litbufLen = 0;
        root->TransferPass1(*this, litbuf);
        Assert(program->rep.insts.litbufLen == finalLen);
    }